

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O3

void __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::insert
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t index,bool bit)

{
  ulong uVar1;
  sbyte sVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  uVar3 = index >> 6;
  uVar4 = (this->_container)._M_elems[uVar3];
  bVar5 = (byte)index & 0x3f;
  sVar2 = (bVar5 < 0x41) * ('@' - bVar5);
  (this->_container)._M_elems[uVar3] =
       (CONCAT71(in_register_00000011,bit) & 0xffffffff) << (index & 0x3f) |
       (uVar4 << sVar2) >> sVar2 | (-1L << (index & 0x3f) & uVar4) * 2;
  if (index < 0xfc0) {
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar7 = vpbroadcastq_avx512f();
    uVar4 = 0;
    auVar8 = vpbroadcastq_avx512f();
    do {
      auVar9 = vpbroadcastq_avx512f();
      auVar9 = vporq_avx512f(auVar9,auVar6);
      uVar1 = vpcmpuq_avx512f(auVar9,auVar8,2);
      auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  ((this->_container)._M_elems + uVar3 + uVar4 + 1));
      auVar10._8_8_ = (ulong)((byte)(uVar1 >> 1) & 1) * auVar9._8_8_;
      auVar10._0_8_ = (ulong)((byte)uVar1 & 1) * auVar9._0_8_;
      auVar10._16_8_ = (ulong)((byte)(uVar1 >> 2) & 1) * auVar9._16_8_;
      auVar10._24_8_ = (ulong)((byte)(uVar1 >> 3) & 1) * auVar9._24_8_;
      auVar10._32_8_ = (ulong)((byte)(uVar1 >> 4) & 1) * auVar9._32_8_;
      auVar10._40_8_ = (ulong)((byte)(uVar1 >> 5) & 1) * auVar9._40_8_;
      auVar10._48_8_ = (ulong)((byte)(uVar1 >> 6) & 1) * auVar9._48_8_;
      auVar10._56_8_ = (uVar1 >> 7) * auVar9._56_8_;
      auVar7 = valignq_avx512f(auVar10,auVar7,7);
      auVar7 = vpshldq_avx512_vbmi2(auVar10,auVar7,1);
      auVar7 = vmovdqu64_avx512f(auVar7);
      *(undefined1 (*) [64])((this->_container)._M_elems + uVar3 + uVar4 + 1) = auVar7;
      uVar4 = uVar4 + 8;
      auVar7 = vmovdqa64_avx512f(auVar10);
    } while ((0x46U - (int)uVar3 & 0x78) != uVar4);
  }
  return;
}

Assistant:

void bitview<Container>::insert(size_t index, bool bit)
        {
            size_t i = index / W;
            size_t pos = index % W;

            word_type word = _container[i];
            word_type mask = word_type(-1) << pos;

            word_type carry = word >> (W - 1);
            _container[i] = ((word &  mask) << 1)    | 
                             (word & ~mask)          | 
                             (word_type(bit) << pos);

            for(size_t j = i + 1; j < _container.size(); ++j) 
            {
                word = _container[j];
                word_type newcarry = word >> (W - 1);
                
                _container[j] = word << 1 | carry;
                carry = newcarry;
            }
        }